

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

shared_ptr<mocker::ir::Addr> __thiscall
mocker::ir::Builder::translateNewArray
          (Builder *this,shared_ptr<mocker::ast::Type> *rawCurType,
          queue<std::shared_ptr<mocker::ir::Addr>,_std::deque<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
          *sizeProvided)

{
  FunctionModule *this_00;
  BuilderContext *pBVar1;
  _Elt_pointer psVar2;
  _Elt_pointer psVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  bool bVar5;
  BBLIter BVar6;
  BBLIter iter;
  BBLIter iter_00;
  BBLIter val;
  deque<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *psVar7;
  shared_ptr<mocker::ir::Reg> *args;
  shared_ptr<mocker::ir::Addr> sVar8;
  __allocated_ptr<std::allocator<std::_Sp_counted_deleter<std::nullptr_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Engineev[P]mocker_compiler_ir_builder_builder_cpp:754:16),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_1c8 [2];
  shared_ptr<mocker::ir::Reg> arrayInstPtr;
  OpType local_18c;
  shared_ptr<mocker::ir::Reg> memPtr;
  shared_ptr<mocker::ir::Reg> curElementPtrPtr;
  shared_ptr<mocker::ast::Type> elementType;
  shared_ptr<mocker::ir::Reg> curElementPtr;
  shared_ptr<mocker::ir::Reg> contentEndPtr;
  shared_ptr<void_*> defer;
  shared_ptr<mocker::ir::Reg> contentLen;
  shared_ptr<mocker::ir::Addr> elementInstPtr;
  shared_ptr<mocker::ir::Reg> cmpRes;
  shared_ptr<mocker::ir::Reg> nextElementPtr;
  shared_ptr<mocker::ir::Jump> jump2condition;
  shared_ptr<mocker::ir::Label> conditionLabel;
  shared_ptr<mocker::ir::Reg> memLen;
  value_type size;
  shared_ptr<mocker::ir::Label> successorLabel;
  shared_ptr<mocker::ir::Label> bodyLabel;
  __shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2> local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2> local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  shared_ptr<mocker::ast::ArrayType> curType;
  shared_ptr<mocker::ir::IRInst> local_48;
  
  this_00 = (FunctionModule *)
            (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi[0x29]._vptr__Sp_counted_base;
  std::dynamic_pointer_cast<mocker::ast::ArrayType,mocker::ast::Type>
            ((shared_ptr<mocker::ast::Type> *)&curType);
  if (curType.super___shared_ptr<mocker::ast::ArrayType,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    __assert_fail("curType",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp"
                  ,0x2d1,
                  "std::shared_ptr<Addr> mocker::ir::Builder::translateNewArray(const std::shared_ptr<ast::Type> &, std::queue<std::shared_ptr<Addr>> &) const"
                 );
  }
  std::__shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&elementType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>,
             &((curType.super___shared_ptr<mocker::ast::ArrayType,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->baseType).super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)
  ;
  std::__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&size.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>,
             &((in_RCX->
               super__Deque_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
               )._M_impl.super__Deque_impl_data._M_start._M_cur)->
              super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>);
  std::deque<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  ::pop_front(in_RCX);
  psVar7 = (string *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"memLen",(allocator<char> *)&contentLen);
  BuilderContext::makeTempLocalReg((BuilderContext *)&memLen,psVar7);
  std::__cxx11::string::~string((string *)local_1c8);
  BuilderContext::emplaceInst<mocker::ir::AttachedComment,char_const(&)[28]>
            ((BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi,(char (*) [28])"Calculate the memory needed");
  psVar7 = (string *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"contentLen",(allocator<char> *)&memPtr);
  BuilderContext::makeTempLocalReg((BuilderContext *)&contentLen,psVar7);
  std::__cxx11::string::~string((string *)local_1c8);
  pBVar1 = (BuilderContext *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  memPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 7;
  makeILit((Builder *)local_1c8,(Integer)psVar7);
  args = &contentLen;
  BuilderContext::
  emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Addr>&>
            (pBVar1,args,(OpType *)&memPtr,(shared_ptr<mocker::ir::Addr> *)local_1c8,&size);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1c8[0]._M_ptr);
  pBVar1 = (BuilderContext *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  memPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 5;
  makeILit((Builder *)local_1c8,(Integer)args);
  BuilderContext::
  emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>>
            (pBVar1,&memLen,(OpType *)&memPtr,&contentLen,(shared_ptr<mocker::ir::Addr> *)local_1c8)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1c8[0]._M_ptr);
  psVar7 = (string *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"memPtr",(allocator<char> *)&arrayInstPtr);
  BuilderContext::makeTempLocalReg((BuilderContext *)&memPtr,psVar7);
  std::__cxx11::string::~string((string *)local_1c8);
  BuilderContext::
  emplaceInst<mocker::ir::Malloc,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
            ((BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi,&memPtr,&memLen);
  psVar7 = (string *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"arrayInstPtr",(allocator<char> *)&defer);
  BuilderContext::makeTempLocalReg((BuilderContext *)&arrayInstPtr,psVar7);
  std::__cxx11::string::~string((string *)local_1c8);
  pBVar1 = (BuilderContext *)
           (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  defer.super___shared_ptr<void_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(defer.super___shared_ptr<void_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,5);
  makeILit((Builder *)local_1c8,(Integer)psVar7);
  BuilderContext::
  emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>>
            (pBVar1,&arrayInstPtr,(OpType *)&defer,&memPtr,(shared_ptr<mocker::ir::Addr> *)local_1c8
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1c8[0]._M_ptr);
  BuilderContext::
  emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>&>
            ((BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi,&memPtr,&size);
  bVar5 = isIntTy((Builder *)rawCurType,&elementType);
  if ((bVar5) || (bVar5 = isBoolTy((Builder *)rawCurType,&elementType), bVar5)) {
LAB_0013934f:
    _Var4._M_pi = arrayInstPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    arrayInstPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(element_type **)this =
         arrayInstPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this->ctx = (BuilderContext *)_Var4._M_pi;
    arrayInstPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    std::dynamic_pointer_cast<mocker::ast::ArrayType,mocker::ast::Type>
              ((shared_ptr<mocker::ast::Type> *)local_1c8);
    if (local_1c8[0]._M_alloc ==
        (allocator<std::_Sp_counted_deleter<std::nullptr_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Engineev[P]mocker_compiler_ir_builder_builder_cpp:754:16),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>
         *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1c8[0]._M_ptr);
    }
    else {
      psVar2 = (in_RCX->
               super__Deque_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
               )._M_impl.super__Deque_impl_data._M_finish._M_cur;
      psVar3 = (in_RCX->
               super__Deque_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
               )._M_impl.super__Deque_impl_data._M_start._M_cur;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1c8[0]._M_ptr);
      if (psVar2 == psVar3) goto LAB_0013934f;
    }
    BuilderContext::emplaceInst<mocker::ir::Comment,char_const(&)[26]>
              ((BuilderContext *)
               (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi,(char (*) [26])"init the content of array");
    defer.super___shared_ptr<void_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    defer.super___shared_ptr<void_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    curElementPtrPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)rawCurType;
    defer.super___shared_ptr<void_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    local_1c8[0]._M_alloc =
         (allocator<std::_Sp_counted_deleter<std::nullptr_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Engineev[P]mocker_compiler_ir_builder_builder_cpp:754:16),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>
          *)&contentEndPtr;
    (defer.super___shared_ptr<void_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
         1;
    (defer.super___shared_ptr<void_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
         = 1;
    (defer.super___shared_ptr<void_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_001f12f8;
    defer.super___shared_ptr<void_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _vptr__Sp_counted_base = (_func_int **)rawCurType;
    defer.super___shared_ptr<void_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]._M_use_count =
         0;
    defer.super___shared_ptr<void_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]._M_weak_count
         = 0;
    local_1c8[0]._M_ptr = (pointer)0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_deleter<std::nullptr_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp:754:16),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr(local_1c8);
    psVar7 = (string *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1c8,"curElementPtrPtr",(allocator<char> *)&contentEndPtr);
    BuilderContext::makeTempLocalReg((BuilderContext *)&curElementPtrPtr,psVar7);
    std::__cxx11::string::~string((string *)local_1c8);
    pBVar1 = (BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    BVar6._M_node =
         (this_00->bbs).
         super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
         _M_node.super__List_node_base._M_next;
    std::make_shared<mocker::ir::Alloca,std::shared_ptr<mocker::ir::Reg>&>
              ((shared_ptr<mocker::ir::Reg> *)local_1c8);
    local_48.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_1c8[0]._M_alloc;
    local_48.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         &(local_1c8[0]._M_ptr)->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
    local_1c8[0]._M_alloc =
         (allocator<std::_Sp_counted_deleter<std::nullptr_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Engineev[P]mocker_compiler_ir_builder_builder_cpp:754:16),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>
          *)0x0;
    local_1c8[0]._M_ptr = (pointer)0x0;
    BuilderContext::appendInstFront(pBVar1,BVar6,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1c8[0]._M_ptr);
    BuilderContext::
    emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
              ((BuilderContext *)
               (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi,&curElementPtrPtr,&arrayInstPtr);
    psVar7 = (string *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1c8,"contentEndPtr",(allocator<char> *)&conditionLabel);
    BuilderContext::makeTempLocalReg((BuilderContext *)&contentEndPtr,psVar7);
    std::__cxx11::string::~string((string *)local_1c8);
    local_1c8[0]._M_alloc._0_4_ = 5;
    BuilderContext::
    emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
              ((BuilderContext *)
               (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi,&contentEndPtr,(OpType *)local_1c8,&arrayInstPtr,&contentLen);
    BVar6 = BuilderContext::getCurBasicBlock
                      ((BuilderContext *)
                       (rawCurType->
                       super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi);
    iter = FunctionModule::insertBBAfter(this_00,BVar6);
    getBBLabel((Builder *)&conditionLabel,(const_iterator)BVar6._M_node);
    BVar6 = iter;
    iter_00 = FunctionModule::insertBBAfter(this_00,iter);
    getBBLabel((Builder *)&bodyLabel,(const_iterator)BVar6._M_node);
    BVar6 = iter_00;
    val = FunctionModule::insertBBAfter(this_00,iter_00);
    getBBLabel((Builder *)&successorLabel,(const_iterator)BVar6._M_node);
    std::make_shared<mocker::ir::Jump,std::shared_ptr<mocker::ir::Label>&>
              ((shared_ptr<mocker::ir::Label> *)&jump2condition);
    pBVar1 = (BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    std::__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ir::Jump,void>
              (local_68,&jump2condition.
                         super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>);
    BuilderContext::appendInst(pBVar1,(shared_ptr<mocker::ir::IRInst> *)local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
    BuilderContext::setCurBasicBlock
              ((BuilderContext *)
               (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi,iter);
    psVar7 = (string *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1c8,"curElementPtr",(allocator<char> *)&cmpRes);
    BuilderContext::makeTempLocalReg((BuilderContext *)&curElementPtr,psVar7);
    std::__cxx11::string::~string((string *)local_1c8);
    BuilderContext::
    emplaceInst<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
              ((BuilderContext *)
               (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi,&curElementPtr,&curElementPtrPtr);
    psVar7 = (string *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1c8,"cmpRes",(allocator<char> *)&elementInstPtr);
    BuilderContext::makeTempLocalReg((BuilderContext *)&cmpRes,psVar7);
    std::__cxx11::string::~string((string *)local_1c8);
    local_1c8[0]._M_alloc =
         (allocator<std::_Sp_counted_deleter<std::nullptr_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Engineev[P]mocker_compiler_ir_builder_builder_cpp:754:16),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>
          *)CONCAT44(local_1c8[0]._M_alloc._4_4_,1);
    BuilderContext::
    emplaceInst<mocker::ir::RelationInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::RelationInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
              ((BuilderContext *)
               (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi,&cmpRes,(OpType *)local_1c8,&curElementPtr,&contentEndPtr);
    BuilderContext::
    emplaceInst<mocker::ir::Branch,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Label>&,std::shared_ptr<mocker::ir::Label>&>
              ((BuilderContext *)
               (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi,&cmpRes,&bodyLabel,&successorLabel);
    BuilderContext::setCurBasicBlock
              ((BuilderContext *)
               (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi,iter_00);
    std::dynamic_pointer_cast<mocker::ast::ArrayType,mocker::ast::Type>
              ((shared_ptr<mocker::ast::Type> *)local_1c8);
    if (local_1c8[0]._M_alloc ==
        (allocator<std::_Sp_counted_deleter<std::nullptr_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Engineev[P]mocker_compiler_ir_builder_builder_cpp:754:16),_std::allocator<void>,_(__gnu_cxx::_Lock_policy)2>_>
         *)0x0) {
      makeNewNonarray((Builder *)&elementInstPtr,rawCurType);
    }
    else {
      translateNewArray((Builder *)&elementInstPtr,rawCurType,
                        (queue<std::shared_ptr<mocker::ir::Addr>,_std::deque<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>_>
                         *)&elementType);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1c8[0]._M_ptr);
    BuilderContext::
    emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>&>
              ((BuilderContext *)
               (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi,&curElementPtr,&elementInstPtr);
    psVar7 = (string *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1c8,"nextElementPtr",(allocator<char> *)&local_18c);
    BuilderContext::makeTempLocalReg((BuilderContext *)&nextElementPtr,psVar7);
    std::__cxx11::string::~string((string *)local_1c8);
    pBVar1 = (BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    local_18c = Add;
    makeILit((Builder *)local_1c8,(Integer)psVar7);
    BuilderContext::
    emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>>
              (pBVar1,&nextElementPtr,&local_18c,&curElementPtr,
               (shared_ptr<mocker::ir::Addr> *)local_1c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1c8[0]._M_ptr);
    BuilderContext::
    emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
              ((BuilderContext *)
               (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi,&curElementPtrPtr,&nextElementPtr);
    pBVar1 = (BuilderContext *)
             (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    std::__shared_ptr<mocker::ir::IRInst,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ir::Jump,void>
              (local_78,&jump2condition.
                         super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>);
    BuilderContext::appendInst(pBVar1,(shared_ptr<mocker::ir::IRInst> *)local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
    BuilderContext::setCurBasicBlock
              ((BuilderContext *)
               (rawCurType->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi,val);
    _Var4 = arrayInstPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ;
    arrayInstPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(element_type **)this =
         arrayInstPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this->ctx = (BuilderContext *)_Var4._M_pi;
    arrayInstPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&nextElementPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&elementInstPtr.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&cmpRes.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&curElementPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&jump2condition.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&successorLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&bodyLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&conditionLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&contentEndPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&curElementPtrPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&defer.super___shared_ptr<void_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&arrayInstPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&memPtr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&contentLen.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&memLen.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&size.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&elementType.super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&curType.super___shared_ptr<mocker::ast::ArrayType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sVar8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::Addr>)
         sVar8.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Addr> Builder::translateNewArray(
    const std::shared_ptr<ast::Type> &rawCurType,
    std::queue<std::shared_ptr<Addr>> &sizeProvided) const {
  // We describe the translation of statements "new T[N]" here. First, note that
  // the result is a pointer arrayInstPtr, which points to the address of the
  // first element of the array. (The length of the array is store in front of
  // the array elements.) It is the return value of this function. Hence, the
  // first step is
  //   1. to malloc a piece of memory of length 8 + 8 * N and store the address
  //      + 8 into arrayInstPtr;
  //   2. and store N into the first 8 bytes.
  // Then, we shall construct the array. If T is int or bool, then there is
  // nothing to do. Otherwise, we shall construct each element via a loop. To
  // implement the loop, we first need aa temporary variable to store the
  // address of the current element since our registers are of SSA form, that
  // is, they can not be assigned more than once. Namely, we shall
  //   3. alloca a piece of memory for the temporary varaible and store the
  //      address into the register curElementPtrPtr. And store the address of
  //      the head, namely, the contentPtr, into the address stored in
  //      curElementPtrPtr. (Meanwhile, we shall compute the address of the
  //      end of the array for later use.)
  // After finishing the routine of creating basic blocks and labels, we
  // construct the condition for the loop to end.
  //   4. Load curElementPtr from the address stored in curElementPtrPtr.
  //   5. Compare it with the end pointer and jump according to the result.
  // Now we implement the body of the loop. In fact, what we need to do is just
  // initializing the current element.
  //   6. New an element. (See next section for details.)
  //   7. Store the address into the current element.
  //   8. Update the loop variable and jump back to the condition basic block.
  //
  // In this passage, we handle some details. First, we need to support newing
  // a jagged array. To achieve this, we let this function to be recursive, that
  // is, in step 6., if the type of the element is still array, then, instead of
  // newing an element, we call this function recursively and pass down the
  // remaining provided sizes.
  // Note that the number of sizes provided may be less than the dimension of
  // the array. This case is similar to the int/bool case. We just return after
  // step 2., leaving the elements uninitialized.

  auto &func = ctx.getCurFunc();
  auto curType = std::dynamic_pointer_cast<ast::ArrayType>(rawCurType);
  assert(curType);
  auto elementType = curType->baseType;

  // 1.
  auto size = sizeProvided.front();
  sizeProvided.pop();
  auto memLen = ctx.makeTempLocalReg("memLen");
  ctx.emplaceInst<AttachedComment>("Calculate the memory needed");
  auto contentLen = ctx.makeTempLocalReg("contentLen");
  ctx.emplaceInst<ArithBinaryInst>(contentLen, ArithBinaryInst::Mul,
                                   makeILit(8),
                                   size); // calcMemLen
  ctx.emplaceInst<ArithBinaryInst>(memLen, ArithBinaryInst::Add, contentLen,
                                   makeILit(8));
  auto memPtr = ctx.makeTempLocalReg("memPtr");
  ctx.emplaceInst<Malloc>(memPtr, memLen);

  auto arrayInstPtr = ctx.makeTempLocalReg("arrayInstPtr");
  ctx.emplaceInst<ArithBinaryInst>(arrayInstPtr, ArithBinaryInst::Add, memPtr,
                                   makeILit(8));

  // 2.
  ctx.emplaceInst<Store>(memPtr, size);

  // 3.
  if (isIntTy(elementType) || isBoolTy(elementType))
    return arrayInstPtr;
  if ((bool)std::dynamic_pointer_cast<ast::ArrayType>(elementType) &&
      sizeProvided.empty())
    return arrayInstPtr;

  ctx.emplaceInst<Comment>("init the content of array");
  auto defer = std::shared_ptr<void *>(
      nullptr, [this](void *) { ctx.emplaceInst<Comment>(""); });

  auto curElementPtrPtr = ctx.makeTempLocalReg("curElementPtrPtr");
  ctx.appendInstFront(func.getFirstBB(),
                      std::make_shared<Alloca>(curElementPtrPtr));
  ctx.emplaceInst<Store>(curElementPtrPtr, arrayInstPtr);
  auto contentEndPtr = ctx.makeTempLocalReg("contentEndPtr");
  // calcContentEndPtr
  ctx.emplaceInst<ArithBinaryInst>(contentEndPtr, ArithBinaryInst::Add,
                                   arrayInstPtr, contentLen);

  auto originBB = ctx.getCurBasicBlock();
  auto conditionFirstBB = func.insertBBAfter(originBB);
  auto conditionLabel = getBBLabel(conditionFirstBB);
  auto bodyFirstBB = func.insertBBAfter(conditionFirstBB);
  auto bodyLabel = getBBLabel(bodyFirstBB);
  auto successorBB = func.insertBBAfter(bodyFirstBB);
  auto successorLabel = getBBLabel(successorBB);

  auto jump2condition = std::make_shared<Jump>(conditionLabel);
  ctx.appendInst(jump2condition);

  // 4.
  ctx.setCurBasicBlock(conditionFirstBB);
  auto curElementPtr = ctx.makeTempLocalReg("curElementPtr");
  ctx.emplaceInst<Load>(curElementPtr, curElementPtrPtr);
  // 5.
  auto cmpRes = ctx.makeTempLocalReg("cmpRes");
  ctx.emplaceInst<RelationInst>(cmpRes, RelationInst::Ne, curElementPtr,
                                contentEndPtr);
  ctx.emplaceInst<Branch>(cmpRes, bodyLabel, successorLabel);

  // 6.
  ctx.setCurBasicBlock(bodyFirstBB);
  auto elementInstPtr =
      (bool)std::dynamic_pointer_cast<ast::ArrayType>(elementType)
          ? translateNewArray(elementType, sizeProvided)
          : makeNewNonarray(elementType);
  // 7.
  ctx.emplaceInst<Store>(curElementPtr, elementInstPtr);
  // 8.
  auto nextElementPtr = ctx.makeTempLocalReg("nextElementPtr");
  ctx.emplaceInst<ArithBinaryInst>(nextElementPtr, ArithBinaryInst::Add,
                                   curElementPtr,
                                   makeILit(8)); // calcNextElementPtr
  ctx.emplaceInst<Store>(curElementPtrPtr, nextElementPtr);
  ctx.appendInst(jump2condition);

  ctx.setCurBasicBlock(successorBB);
  return arrayInstPtr;
}